

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O2

bool __thiscall Kumu::Timestamp::Unarchive(Timestamp *this,MemIOReader *Reader)

{
  bool bVar1;
  ui8_t minute;
  ui8_t hour;
  ui8_t day;
  ui8_t month;
  ui16_t year;
  ui8_t tick;
  ui8_t second;
  ui8_t local_20;
  ui8_t local_1f;
  ui8_t local_1e;
  ui8_t local_1d;
  ui16_t local_1c;
  ui8_t local_1a;
  ui8_t local_19;
  
  if (Reader == (MemIOReader *)0x0) {
    __assert_fail("Reader",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                  ,0x3dd,"virtual bool Kumu::Timestamp::Unarchive(MemIOReader *)");
  }
  bVar1 = MemIOReader::ReadUi16BE(Reader,&local_1c);
  if ((((bVar1) && (bVar1 = MemIOReader::ReadUi8(Reader,&local_1d), bVar1)) &&
      (bVar1 = MemIOReader::ReadUi8(Reader,&local_1e), bVar1)) &&
     ((bVar1 = MemIOReader::ReadUi8(Reader,&local_1f), bVar1 &&
      (bVar1 = MemIOReader::ReadUi8(Reader,&local_20), bVar1)))) {
    bVar1 = MemIOReader::ReadUi8(Reader,&local_19);
    if ((bVar1) && (bVar1 = MemIOReader::ReadUi8(Reader,&local_1a), bVar1)) {
      SetComponents(this,&local_1c,&local_1d,&local_1e,&local_1f,&local_20,&local_19);
      return true;
    }
  }
  return false;
}

Assistant:

bool
Kumu::Timestamp::Unarchive(MemIOReader* Reader)
{
  ui16_t year;
  ui8_t month, day, hour, minute, second, tick;

  assert(Reader);
  if ( ! Reader->ReadUi16BE(&year) ) return false;
  if ( ! Reader->ReadUi8(&month) ) return false;
  if ( ! Reader->ReadUi8(&day) ) return false;
  if ( ! Reader->ReadUi8(&hour) ) return false;
  if ( ! Reader->ReadUi8(&minute) ) return false;
  if ( ! Reader->ReadUi8(&second) ) return false;
  if ( ! Reader->ReadUi8(&tick) ) return false;
  SetComponents(year, month, day, hour, minute, second);
  return true;
}